

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_cs.c
# Opt level: O2

cupdlp_dcs * cupdlp_dcs_spalloc(int m,int n,int nzmax,int values,int triplet)

{
  int n_00;
  cupdlp_dcs *A;
  int *piVar1;
  int *piVar2;
  double *pdVar3;
  int n_01;
  
  A = (cupdlp_dcs *)calloc(1,0x30);
  if (A != (cupdlp_dcs *)0x0) {
    A->m = m;
    A->n = n;
    n_01 = 1;
    if (1 < nzmax) {
      n_01 = nzmax;
    }
    A->nzmax = n_01;
    n_00 = n + 1;
    if (triplet != 0) {
      n_00 = n_01;
    }
    A->nz = -(uint)(triplet == 0);
    piVar1 = (int *)cupdlp_dcs_malloc(n_00,4);
    A->p = piVar1;
    piVar2 = (int *)cupdlp_dcs_malloc(n_01,4);
    A->i = piVar2;
    if (values == 0) {
      pdVar3 = (double *)0x0;
    }
    else {
      pdVar3 = (double *)cupdlp_dcs_malloc(n_01,8);
    }
    A->x = pdVar3;
    if (((piVar1 != (int *)0x0) && (piVar2 != (int *)0x0)) &&
       (values == 0 || pdVar3 != (double *)0x0)) {
      return A;
    }
    cupdlp_dcs_spfree(A);
  }
  return (cupdlp_dcs *)0x0;
}

Assistant:

cupdlp_dcs *cupdlp_dcs_spalloc(int m, int n, int nzmax, int values,
                               int triplet) {
  cupdlp_dcs *A = cupdlp_dcs_calloc(
      1, sizeof(cupdlp_dcs)); /* allocate the cupdlp_dcs struct */
  if (!A) return (NULL);      /* out of memory */
  A->m = m;                   /* define dimensions and nzmax */
  A->n = n;
  A->nzmax = nzmax = MAX(nzmax, 1);
  A->nz = triplet ? 0 : -1; /* allocate triplet or comp.col */
  A->p = cupdlp_dcs_malloc(triplet ? nzmax : n + 1, sizeof(int));
  A->i = cupdlp_dcs_malloc(nzmax, sizeof(int));
  A->x = values ? cupdlp_dcs_malloc(nzmax, sizeof(double)) : NULL;
  return ((!A->p || !A->i || (values && !A->x)) ? cupdlp_dcs_spfree(A) : A);
}